

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_sasl_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms)

{
  AMQP_VALUE pAVar1;
  
  if (sasl_mechanisms != (SASL_MECHANISMS_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(sasl_mechanisms->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms)
{
    AMQP_VALUE result;

    if (sasl_mechanisms == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms;
        result = amqpvalue_clone(sasl_mechanisms_instance->composite_value);
    }

    return result;
}